

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O2

shared_ptr<helics::Core> helics::CoreFactory::makeCore(CoreType type,string_view name)

{
  element_type *peVar1;
  shared_ptr<helics::CoreFactory::CoreBuilder> *psVar2;
  HelicsException *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int code;
  undefined4 in_register_0000003c;
  __shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *this_00;
  string_view message;
  shared_ptr<helics::Core> sVar4;
  
  this_00 = (__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)
            CONCAT44(in_register_0000003c,type);
  code = (int)name._M_len;
  if (code == 0) {
    psVar2 = MasterCoreBuilder::getIndexedBuilder(0);
  }
  else {
    if (code == 0x4d) {
      std::__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (this_00,(__shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2> *)emptyCore);
      _Var3._M_pi = extraout_RDX;
      goto LAB_0023414b;
    }
    if (code == 0x42) {
      this = (HelicsException *)__cxa_allocate_exception(0x28);
      message._M_str = "nullcore is explicitly not available nor will ever be";
      message._M_len = 0x35;
      HelicsException::HelicsException(this,message);
      __cxa_throw(this,&HelicsException::typeinfo,HelicsException::~HelicsException);
    }
    psVar2 = MasterCoreBuilder::getBuilder(code);
  }
  peVar1 = (psVar2->super___shared_ptr<helics::CoreFactory::CoreBuilder,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  (**peVar1->_vptr_CoreBuilder)(this_00,peVar1,name._M_str);
  _Var3._M_pi = extraout_RDX_00;
LAB_0023414b:
  sVar4.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi
  ;
  sVar4.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  return (shared_ptr<helics::Core>)
         sVar4.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core> makeCore(CoreType type, std::string_view name)
{
    if (type == CoreType::NULLCORE) {
        throw(HelicsException("nullcore is explicitly not available nor will ever be"));
    }
    if (type == CoreType::DEFAULT) {
        return MasterCoreBuilder::getIndexedBuilder(0)->build(name);
    }
    if (type == CoreType::EMPTY) {
        return emptyCore;
    }
    return MasterCoreBuilder::getBuilder(static_cast<int>(type))->build(name);
}